

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

Instr * __thiscall
Lowerer::SplitBailOnImplicitCall
          (Lowerer *this,Instr *instr,Instr *helperCall,Instr *insertBeforeInstr)

{
  Opnd *opnd;
  IntConstOpnd *opnd_00;
  BailOutInfo *bailOutInfo;
  BailOutInstrTemplate<IR::Instr> *this_00;
  undefined1 local_68 [8];
  AutoReuseOpnd autoReuseImplicitCallFlags;
  AutoReuseOpnd autoReuseNoImplicitCall;
  
  opnd = GetImplicitCallFlagsOpnd(this);
  IR::AutoReuseOpnd::AutoReuseOpnd((AutoReuseOpnd *)local_68,opnd,instr->m_func,true);
  opnd_00 = IR::IntConstOpnd::New(1,TyInt8,this->m_func,true);
  IR::AutoReuseOpnd::AutoReuseOpnd
            ((AutoReuseOpnd *)&autoReuseImplicitCallFlags.autoDelete,&opnd_00->super_Opnd,
             instr->m_func,true);
  InsertMove(opnd,&opnd_00->super_Opnd,helperCall->m_prev,true);
  bailOutInfo = IR::Instr::GetBailOutInfo(instr);
  if (bailOutInfo->bailOutInstr == instr) {
    bailOutInfo->bailOutInstr = (Instr *)0x0;
  }
  this_00 = IR::BailOutInstrTemplate<IR::Instr>::New
                      (BailOnNotEqual,BailOutOnImplicitCalls,bailOutInfo,bailOutInfo->bailOutFunc);
  IR::Instr::SetSrc1(&this_00->super_Instr,opnd);
  IR::Instr::SetSrc2(&this_00->super_Instr,&opnd_00->super_Opnd);
  IR::Instr::InsertBefore(insertBeforeInstr,&this_00->super_Instr);
  IR::Instr::ClearBailOutInfo(instr);
  IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)&autoReuseImplicitCallFlags.autoDelete);
  IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)local_68);
  return &this_00->super_Instr;
}

Assistant:

IR::Instr *
Lowerer::SplitBailOnImplicitCall(IR::Instr * instr, IR::Instr * helperCall, IR::Instr * insertBeforeInstr)
{
    IR::Opnd * implicitCallFlags = this->GetImplicitCallFlagsOpnd();
    const IR::AutoReuseOpnd autoReuseImplicitCallFlags(implicitCallFlags, instr->m_func);
    IR::IntConstOpnd * noImplicitCall = IR::IntConstOpnd::New(Js::ImplicitCall_None, TyInt8, this->m_func, true);
    const IR::AutoReuseOpnd autoReuseNoImplicitCall(noImplicitCall, instr->m_func);

    // Reset the implicit call flag on every helper call
    Lowerer::InsertMove(implicitCallFlags, noImplicitCall, helperCall->m_prev);

    BailOutInfo * bailOutInfo = instr->GetBailOutInfo();
    if (bailOutInfo->bailOutInstr == instr)
    {
        bailOutInfo->bailOutInstr = nullptr;
    }
    IR::Instr * bailOutInstr = IR::BailOutInstr::New(Js::OpCode::BailOnNotEqual, IR::BailOutOnImplicitCalls, bailOutInfo, bailOutInfo->bailOutFunc);
    bailOutInstr->SetSrc1(implicitCallFlags);
    bailOutInstr->SetSrc2(noImplicitCall);

    insertBeforeInstr->InsertBefore(bailOutInstr);
    instr->ClearBailOutInfo();
    return bailOutInstr;
}